

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

char * __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  char cVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  char *pcVar7;
  string *psVar8;
  cmState *this_00;
  long lVar9;
  undefined1 local_222;
  undefined1 local_221;
  cmStateSnapshot local_220;
  undefined1 local_208 [64];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_LIBRARIES_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_),
     iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_,"TYPE",
               (allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_,
               "INCLUDE_DIRECTORIES",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_FEATURES_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_,
               "COMPILE_FEATURES",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_,
               "COMPILE_OPTIONS",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_,
               "COMPILE_DEFINITIONS",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_,
               "LINK_OPTIONS",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_,
               "LINK_DIRECTORIES",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_
                                 ), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_,
               "IMPORTED",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propIMPORTED_GLOBAL_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_,
               "IMPORTED_GLOBAL",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                      propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
               ,"MANUALLY_ADDED_DEPENDENCIES",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::
                  propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_),
     iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_,"NAME",
               (allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propBINARY_DIR_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_,
               "BINARY_DIR",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propSOURCE_DIR_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_,
               "SOURCE_DIR",(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_)
     , iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_,"SOURCES"
               ,(allocator<char> *)local_208);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                                 ), iVar5 != 0)) {
    std::__cxx11::string::string
              ((string *)local_208,
               (string *)&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_);
    std::__cxx11::string::string
              ((string *)(local_208 + 0x20),
               (string *)&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_);
    std::__cxx11::string::string
              (local_1c8,
               (string *)
               &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_1a8,
               (string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_)
    ;
    std::__cxx11::string::string
              (local_188,
               (string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_168,
               (string *)
               &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_148,
               (string *)&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_128,
               (string *)&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_)
    ;
    std::__cxx11::string::string
              (local_108,
               (string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_);
    std::__cxx11::string::string
              (local_e8,(string *)
                        &GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_);
    std::__cxx11::string::string
              (local_c8,(string *)
                        &GetProperty(std::__cxx11::string_const&)::
                         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_a8,(string *)&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_);
    std::__cxx11::string::string
              (local_88,(string *)
                        &GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_);
    std::__cxx11::string::string
              (local_68,(string *)
                        &GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_);
    std::__cxx11::string::string
              (local_48,(string *)&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_)
    ;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,local_208,
               &stack0xffffffffffffffd8,0,&local_220,&local_221,&local_222);
    lVar9 = 0x1c0;
    do {
      std::__cxx11::string::~string((string *)(local_208 + lVar9));
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != -0x20);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
  }
  sVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_._M_h,prop);
  if (sVar6 == 0) {
LAB_002c1f35:
    pcVar7 = cmPropertyMap::GetPropertyValue
                       (&((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                         Properties,prop);
    if (pcVar7 == (char *)0x0) {
      this_00 = cmMakefile::GetState
                          (((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           Makefile);
      pcVar7 = (pointer)0x0;
      bVar4 = cmState::IsPropertyChained(this_00,prop,TARGET);
      if (bVar4) {
        cmMakefile::GetStateSnapshot
                  (((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_208,&local_220);
        pcVar7 = cmStateDirectory::GetProperty((cmStateDirectory *)local_208,prop,true);
      }
    }
  }
  else {
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                  propLINK_LIBRARIES_abi_cxx11_);
    if (_Var3) {
      _Var2._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      if (*(pointer *)
           &((_Var2._M_head_impl)->LinkImplementationPropertyEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          != *(pointer *)((long)&(_Var2._M_head_impl)->LinkImplementationPropertyEntries + 8)) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar5 != 0)) {
          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
               (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0'
          ;
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)local_208,
                   &((this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                    LinkImplementationPropertyEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)local_208);
        std::__cxx11::string::~string((string *)local_208);
        return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
      }
    }
    else {
      _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_);
      if (_Var3) {
        pcVar7 = cmState::GetTargetTypeName
                           (((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            TargetType);
        return pcVar7;
      }
      _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                    propINCLUDE_DIRECTORIES_abi_cxx11_);
      if (_Var3) {
        _Var2._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        if (*(pointer *)
             &((_Var2._M_head_impl)->IncludeDirectoriesEntries).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            != *(pointer *)((long)&(_Var2._M_head_impl)->IncludeDirectoriesEntries + 8)) {
          if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
             (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                           output_abi_cxx11_), iVar5 != 0)) {
            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                 (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] =
                 '\0';
            __cxa_atexit(std::__cxx11::string::~string,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle)
            ;
            __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_208,
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      IncludeDirectoriesEntries,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                     (string *)local_208);
          std::__cxx11::string::~string((string *)local_208);
          return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
        }
      }
      else {
        _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                      propCOMPILE_FEATURES_abi_cxx11_);
        if (_Var3) {
          _Var2._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          if (*(pointer *)
               &((_Var2._M_head_impl)->CompileFeaturesEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              != *(pointer *)((long)&(_Var2._M_head_impl)->CompileFeaturesEntries + 8)) {
            if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
               (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                             output_abi_cxx11_), iVar5 != 0)) {
              GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                   (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
              GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
              GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] =
                   '\0';
              __cxa_atexit(std::__cxx11::string::~string,
                           &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                           &__dso_handle);
              __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
            }
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)local_208,
                       &((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        CompileFeaturesEntries,";");
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                       (string *)local_208);
            std::__cxx11::string::~string((string *)local_208);
            return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
          }
        }
        else {
          _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                        propCOMPILE_OPTIONS_abi_cxx11_);
          if (_Var3) {
            _Var2._M_head_impl =
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            if (*(pointer *)
                 &((_Var2._M_head_impl)->CompileOptionsEntries).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                != *(pointer *)((long)&(_Var2._M_head_impl)->CompileOptionsEntries + 8)) {
              if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
                 (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                               output_abi_cxx11_), iVar5 != 0)) {
                GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                     (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
                GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
                GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0]
                     = '\0';
                __cxa_atexit(std::__cxx11::string::~string,
                             &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                             &__dso_handle);
                __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
              }
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)local_208,
                         &((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          CompileOptionsEntries,";");
              std::__cxx11::string::operator=
                        ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                         (string *)local_208);
              std::__cxx11::string::~string((string *)local_208);
              return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
            }
          }
          else {
            _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                          propCOMPILE_DEFINITIONS_abi_cxx11_);
            if (_Var3) {
              _Var2._M_head_impl =
                   (this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              if (*(pointer *)
                   &((_Var2._M_head_impl)->CompileDefinitionsEntries).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  != *(pointer *)((long)&(_Var2._M_head_impl)->CompileDefinitionsEntries + 8)) {
                if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
                   (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                                 output_abi_cxx11_), iVar5 != 0)) {
                  GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                       (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2
                  ;
                  GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
                  GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf
                  [0] = '\0';
                  __cxa_atexit(std::__cxx11::string::~string,
                               &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                               &__dso_handle);
                  __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
                }
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((string *)local_208,
                           &((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            CompileDefinitionsEntries,";");
                std::__cxx11::string::operator=
                          ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                           (string *)local_208);
                std::__cxx11::string::~string((string *)local_208);
                return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
              }
            }
            else {
              _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                            propLINK_OPTIONS_abi_cxx11_);
              if (_Var3) {
                _Var2._M_head_impl =
                     (this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                if (*(pointer *)
                     &((_Var2._M_head_impl)->LinkOptionsEntries).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    != *(pointer *)((long)&(_Var2._M_head_impl)->LinkOptionsEntries + 8)) {
                  if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
                     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                                   output_abi_cxx11_), iVar5 != 0)) {
                    GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                         (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.
                                   field_2;
                    GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0
                    ;
                    GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf
                    [0] = '\0';
                    __cxa_atexit(std::__cxx11::string::~string,
                                 &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                                 &__dso_handle);
                    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       );
                  }
                  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((string *)local_208,
                             &((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              LinkOptionsEntries,";");
                  std::__cxx11::string::operator=
                            ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                             (string *)local_208);
                  std::__cxx11::string::~string((string *)local_208);
                  return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus.
                         _M_p;
                }
              }
              else {
                _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                              propLINK_DIRECTORIES_abi_cxx11_);
                if (_Var3) {
                  _Var2._M_head_impl =
                       (this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                  if (*(pointer *)
                       &((_Var2._M_head_impl)->LinkDirectoriesEntries).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      != *(pointer *)((long)&(_Var2._M_head_impl)->LinkDirectoriesEntries + 8)) {
                    if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
                       (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                                     output_abi_cxx11_), iVar5 != 0)) {
                      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                           (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.
                                     field_2;
                      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length =
                           0;
                      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2.
                      _M_local_buf[0] = '\0';
                      __cxa_atexit(std::__cxx11::string::~string,
                                   &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                                   &__dso_handle);
                      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                                           output_abi_cxx11_);
                    }
                    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              ((string *)local_208,
                               &((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                LinkDirectoriesEntries,";");
                    std::__cxx11::string::operator=
                              ((string *)
                               &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                               (string *)local_208);
                    std::__cxx11::string::~string((string *)local_208);
                    return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus.
                           _M_p;
                  }
                }
                else {
                  _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                                propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
                  if (!_Var3) {
                    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                                  propIMPORTED_abi_cxx11_);
                    if (_Var3) {
                      cVar1 = ((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              IsImportedTarget;
LAB_002c1e88:
                      if (cVar1 == '\0') {
                        return "FALSE";
                      }
                      return "TRUE";
                    }
                    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                                  propIMPORTED_GLOBAL_abi_cxx11_);
                    if (_Var3) {
                      cVar1 = ((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              ImportedGloballyVisible;
                      goto LAB_002c1e88;
                    }
                    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                                  propNAME_abi_cxx11_);
                    if (_Var3) {
                      return (((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                             Name)._M_dataplus._M_p;
                    }
                    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                                  propBINARY_DIR_abi_cxx11_);
                    if (_Var3) {
                      cmMakefile::GetStateSnapshot
                                (((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 Makefile);
                      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_208,&local_220);
                      psVar8 = cmStateDirectory::GetCurrentBinary_abi_cxx11_
                                         ((cmStateDirectory *)local_208);
LAB_002c1f30:
                      return (psVar8->_M_dataplus)._M_p;
                    }
                    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                                  propSOURCE_DIR_abi_cxx11_);
                    if (_Var3) {
                      cmMakefile::GetStateSnapshot
                                (((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 Makefile);
                      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_208,&local_220);
                      psVar8 = cmStateDirectory::GetCurrentSource_abi_cxx11_
                                         ((cmStateDirectory *)local_208);
                      goto LAB_002c1f30;
                    }
                    goto LAB_002c1f35;
                  }
                  if (*(size_t *)
                       ((long)&((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               Utilities + 0x28) != 0) {
                    if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
                       (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                                     output_abi_cxx11_), iVar5 != 0)) {
                      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                           (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.
                                     field_2;
                      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length =
                           0;
                      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2.
                      _M_local_buf[0] = '\0';
                      __cxa_atexit(std::__cxx11::string::~string,
                                   &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                                   &__dso_handle);
                      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                                           output_abi_cxx11_);
                    }
                    cmJoin<std::set<BT<std::__cxx11::string>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>>
                              ((string *)local_208,
                               &((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                Utilities,";");
                    std::__cxx11::string::operator=
                              ((string *)
                               &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                               (string *)local_208);
                    std::__cxx11::string::~string((string *)local_208);
                    return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus.
                           _M_p;
                  }
                }
              }
            }
          }
        }
      }
    }
    pcVar7 = (pointer)0x0;
  }
  return pcVar7;
}

Assistant:

const char* cmTarget::GetProperty(const std::string& prop) const
{
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(TYPE);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(LINK_OPTIONS);
  MAKE_STATIC_PROP(LINK_DIRECTORIES);
  MAKE_STATIC_PROP(IMPORTED);
  MAKE_STATIC_PROP(IMPORTED_GLOBAL);
  MAKE_STATIC_PROP(MANUALLY_ADDED_DEPENDENCIES);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(BINARY_DIR);
  MAKE_STATIC_PROP(SOURCE_DIR);
  MAKE_STATIC_PROP(SOURCES);
#undef MAKE_STATIC_PROP
  static std::unordered_set<std::string> const specialProps{
    propLINK_LIBRARIES,
    propTYPE,
    propINCLUDE_DIRECTORIES,
    propCOMPILE_FEATURES,
    propCOMPILE_OPTIONS,
    propCOMPILE_DEFINITIONS,
    propLINK_OPTIONS,
    propLINK_DIRECTORIES,
    propIMPORTED,
    propIMPORTED_GLOBAL,
    propMANUALLY_ADDED_DEPENDENCIES,
    propNAME,
    propBINARY_DIR,
    propSOURCE_DIR,
    propSOURCES
  };
  if (specialProps.count(prop)) {
    if (prop == propLINK_LIBRARIES) {
      if (impl->LinkImplementationPropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->LinkImplementationPropertyEntries, ";");
      return output.c_str();
    }
    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmState::GetTargetTypeName(this->GetType());
    }
    if (prop == propINCLUDE_DIRECTORIES) {
      if (impl->IncludeDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->IncludeDirectoriesEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_FEATURES) {
      if (impl->CompileFeaturesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->CompileFeaturesEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_OPTIONS) {
      if (impl->CompileOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->CompileOptionsEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_DEFINITIONS) {
      if (impl->CompileDefinitionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->CompileDefinitionsEntries, ";");
      return output.c_str();
    }
    if (prop == propLINK_OPTIONS) {
      if (impl->LinkOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->LinkOptionsEntries, ";");
      return output.c_str();
    }
    if (prop == propLINK_DIRECTORIES) {
      if (impl->LinkDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->LinkDirectoriesEntries, ";");

      return output.c_str();
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (impl->Utilities.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->Utilities, ";");
      return output.c_str();
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? "TRUE" : "FALSE";
    }
    if (prop == propIMPORTED_GLOBAL) {
      return this->IsImportedGloballyVisible() ? "TRUE" : "FALSE";
    }
    if (prop == propNAME) {
      return this->GetName().c_str();
    }
    if (prop == propBINARY_DIR) {
      return impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetCurrentBinary()
        .c_str();
    }
    if (prop == propSOURCE_DIR) {
      return impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetCurrentSource()
        .c_str();
    }
  }

  const char* retVal = impl->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain =
      impl->Makefile->GetState()->IsPropertyChained(prop, cmProperty::TARGET);
    if (chain) {
      return impl->Makefile->GetStateSnapshot().GetDirectory().GetProperty(
        prop, chain);
    }
  }
  return retVal;
}